

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::updateGeometry(XFormWidget *this)

{
  SceneObject *pSVar1;
  HalfedgeElement *pHVar2;
  reference pvVar3;
  long local_1c8;
  Joint *local_1b8;
  undefined1 local_1a0 [72];
  double local_158;
  double local_150;
  double local_148;
  Vector3D local_140;
  Vector3D local_128;
  Vector3D local_110;
  Vector3D local_f8;
  Vector3D local_e0;
  undefined1 local_c8 [72];
  undefined1 local_80 [72];
  long local_38;
  Joint *j;
  double local_28;
  double local_20;
  Joint *local_18;
  Joint *joint;
  XFormWidget *this_local;
  
  if ((this->target).object != (SceneObject *)0x0) {
    joint = (Joint *)this;
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(&this->axes,3);
    if ((this->objectMode & 1U) == 0) {
      if ((this->target).element != (HalfedgeElement *)0x0) {
        if ((this->transformedMode & 1U) == 0) {
          (**((this->target).element)->_vptr_HalfedgeElement)(&local_158);
          (this->center).x = local_158;
          (this->center).y = local_150;
          (this->center).z = local_148;
        }
        else {
          (**((this->target).element)->_vptr_HalfedgeElement)(&local_140);
          Vector3D::operator+(&local_128,&local_140,&((this->target).object)->position);
          (this->center).x = local_128.x;
          (this->center).y = local_128.y;
          (this->center).z = local_128.z;
        }
        (*((this->target).element)->_vptr_HalfedgeElement[1])(local_1a0);
        memcpy(&this->bounds,local_1a0,0x48);
        pHVar2 = (this->target).element;
        (*pHVar2->_vptr_HalfedgeElement[2])(pHVar2,&this->axes);
      }
    }
    else {
      pSVar1 = (this->target).object;
      if (pSVar1 == (SceneObject *)0x0) {
        local_1b8 = (Joint *)0x0;
      }
      else {
        local_1b8 = (Joint *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Joint::typeinfo,0);
      }
      local_18 = local_1b8;
      if (local_1b8 == (Joint *)0x0) {
        pSVar1 = (this->target).object;
        (this->center).x = (pSVar1->position).x;
        (this->center).y = (pSVar1->position).y;
        (this->center).z = (pSVar1->position).z;
      }
      else {
        Joint::getBasePosInWorld((Vector3D *)&j,local_1b8);
        (this->center).x = (double)j;
        (this->center).y = local_28;
        (this->center).z = local_20;
      }
      if (((this->jointMode & 1U) == 0) || ((this->jointIsRoot & 1U) == 0)) {
        (*((this->target).object)->_vptr_SceneObject[4])(local_c8);
        memcpy(&this->bounds,local_c8,0x48);
      }
      else {
        pSVar1 = (this->target).object;
        if (pSVar1 == (SceneObject *)0x0) {
          local_1c8 = 0;
        }
        else {
          local_1c8 = __dynamic_cast(pSVar1,&SceneObject::typeinfo,&Joint::typeinfo,0);
        }
        local_38 = local_1c8;
        if (local_1c8 != 0) {
          (**(code **)(**(long **)(*(long *)(local_1c8 + 0x140) + 0xf0) + 0x20))(local_80);
          memcpy(&this->bounds,local_80,0x48);
        }
      }
      if (local_18 == (Joint *)0x0) {
        Vector3D::Vector3D(&local_e0,1.0,0.0,0.0);
        pvVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                           (&this->axes,0);
        pvVar3->x = local_e0.x;
        pvVar3->y = local_e0.y;
        pvVar3->z = local_e0.z;
        Vector3D::Vector3D(&local_f8,0.0,1.0,0.0);
        pvVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                           (&this->axes,1);
        pvVar3->x = local_f8.x;
        pvVar3->y = local_f8.y;
        pvVar3->z = local_f8.z;
        Vector3D::Vector3D(&local_110,0.0,0.0,1.0);
        pvVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                           (&this->axes,2);
        pvVar3->x = local_110.x;
        pvVar3->y = local_110.y;
        pvVar3->z = local_110.z;
      }
      else {
        Joint::getAxes(local_18,&this->axes);
      }
    }
  }
  return;
}

Assistant:

void XFormWidget::updateGeometry()
{
  if (target.object == nullptr) return;

   axes.resize(3);
   if (objectMode) {
     Joint* joint = dynamic_cast<Joint*>(target.object);
     if (joint != nullptr)
       center = joint->getBasePosInWorld();
     else
       center = target.object->position;
     if (jointMode && jointIsRoot)
     {
        Joint* j = dynamic_cast<Joint*>(target.object);
        if (j != nullptr)
           bounds = j->skeleton->mesh->get_bbox();
     }
     else
       bounds = target.object->get_bbox();
     if (joint != nullptr)
     {
       joint->getAxes(axes);
     }
     else
     {
       axes[0] = Vector3D(1., 0., 0.);
       axes[1] = Vector3D(0., 1., 0.);
       axes[2] = Vector3D(0., 0., 1.);
     }
   } else {
     if (target.element == nullptr) return;
     if (transformedMode) {
       center = target.element->centroid() + target.object->position;
     }
     else {
       center = target.element->centroid();
     }
     bounds = target.element->bounds();
     target.element->getAxes( axes );
   }
}